

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::urem(APInt *this,APInt *RHS)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  APInt *in_RDX;
  uint64_t val;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  uint numBits;
  uint lhsWords;
  APInt AVar6;
  
  numBits = RHS->BitWidth;
  if (numBits != in_RDX->BitWidth) {
    __assert_fail("BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x658,"APInt llvm::APInt::urem(const APInt &) const");
  }
  if (numBits < 0x41) {
    if ((in_RDX->U).VAL == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Remainder by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x65a,"APInt llvm::APInt::urem(const APInt &) const");
    }
    val = (RHS->U).VAL % (in_RDX->U).VAL;
  }
  else {
    uVar2 = countLeadingZerosSlowCase(RHS);
    uVar3 = countLeadingZerosSlowCase(in_RDX);
    if (numBits == uVar3) {
      __assert_fail("rhsWords && \"Performing remainder operation by zero ???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x664,"APInt llvm::APInt::urem(const APInt &) const");
    }
    if ((numBits != uVar2) && (numBits - uVar3 != 1)) {
      lhsWords = (uint)((ulong)(numBits - uVar2) + 0x3f >> 6);
      uVar2 = (uint)((ulong)(numBits - uVar3) + 0x3f >> 6);
      if ((lhsWords < uVar2) || (iVar4 = compare(RHS,in_RDX), iVar4 < 0)) {
        APInt(this,RHS);
        uVar5 = extraout_RDX_00;
        goto LAB_0019bd45;
      }
      bVar1 = operator==(RHS,in_RDX);
      if (!bVar1) {
        numBits = RHS->BitWidth;
        if (lhsWords != 1) {
          APInt(this,numBits,0,false);
          divide((RHS->U).pVal,lhsWords,(in_RDX->U).pVal,uVar2,(WordType *)0x0,(this->U).pVal);
          uVar5 = extraout_RDX_01;
          goto LAB_0019bd45;
        }
        val = *(RHS->U).pVal % *(in_RDX->U).pVal;
        goto LAB_0019bd3e;
      }
      numBits = RHS->BitWidth;
    }
    val = 0;
  }
LAB_0019bd3e:
  APInt(this,numBits,val,false);
  uVar5 = extraout_RDX;
LAB_0019bd45:
  AVar6._8_8_ = uVar5;
  AVar6.U.pVal = (uint64_t *)this;
  return AVar6;
}

Assistant:

APInt APInt::urem(const APInt &RHS) const {
  assert(BitWidth == RHS.BitWidth && "Bit widths must be the same");
  if (isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Remainder by zero?");
    return APInt(BitWidth, U.VAL % RHS.U.VAL);
  }

  // Get some facts about the LHS
  unsigned lhsWords = getNumWords(getActiveBits());

  // Get some facts about the RHS
  unsigned rhsBits = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Performing remainder operation by zero ???");

  // Check the degenerate cases
  if (lhsWords == 0)
    // 0 % Y ===> 0
    return APInt(BitWidth, 0);
  if (rhsBits == 1)
    // X % 1 ===> 0
    return APInt(BitWidth, 0);
  if (lhsWords < rhsWords || this->ult(RHS))
    // X % Y ===> X, iff X < Y
    return *this;
  if (*this == RHS)
    // X % X == 0;
    return APInt(BitWidth, 0);
  if (lhsWords == 1)
    // All high words are zero, just use native remainder
    return APInt(BitWidth, U.pVal[0] % RHS.U.pVal[0]);

  // We have to compute it the hard way. Invoke the Knuth divide algorithm.
  APInt Remainder(BitWidth, 0);
  divide(U.pVal, lhsWords, RHS.U.pVal, rhsWords, nullptr, Remainder.U.pVal);
  return Remainder;
}